

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char>::operator()(default_arg_formatter<char> *this,handle h)

{
  iterator iVar1;
  parse_context_type *in_RDI;
  context format_ctx;
  basic_format_parse_context<char,_fmt::v8::detail::error_handler> parse_ctx;
  locale_ref loc;
  basic_format_context<fmt::v8::appender,_char> local_70;
  basic_string_view<char> local_48;
  basic_format_parse_context<char,_fmt::v8::detail::error_handler> local_38 [2];
  
  basic_string_view<char>::basic_string_view(&local_48);
  basic_format_parse_context<char,_fmt::v8::detail::error_handler>::basic_format_parse_context
            (local_38,local_48.data_,local_48.size_,0);
  loc.locale_ = in_RDI[1].format_str_.data_;
  basic_format_context<fmt::v8::appender,_char>::basic_format_context
            (&local_70,(appender)(in_RDI->format_str_).data_,
             *(basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
              &(in_RDI->format_str_).size_,loc);
  basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>::handle::format
            ((handle *)loc.locale_,in_RDI,(basic_format_context<fmt::v8::appender,_char> *)0x11f061)
  ;
  iVar1 = basic_format_context<fmt::v8::appender,_char>::out(&local_70);
  return (iterator)
         iVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

auto operator()(typename basic_format_arg<context>::handle h) -> iterator {
    basic_format_parse_context<Char> parse_ctx({});
    context format_ctx(out, args, loc);
    h.format(parse_ctx, format_ctx);
    return format_ctx.out();
  }